

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::cMove(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Char value;
  uint uVar1;
  Cell index;
  Cell index_00;
  
  requireDStackDepth(this,3,"CMOVE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  index_00 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  for (; uVar1 != 0; uVar1 = uVar1 - 1) {
    value = dataSpaceAt(this,index_00);
    dataSpaceSet(this,index,value);
    index_00 = index_00 + 1;
    index = index + 1;
  }
  return;
}

Assistant:

void cMove() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(dst + i, dataSpaceAt(src + i));
			}
		}